

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cpu.cpp
# Opt level: O2

int get_thread_siblings(int cpuid)

{
  FILE *__stream;
  int thread_siblings;
  char path [256];
  
  sprintf(path,"/sys/devices/system/cpu/cpu%d/topology/thread_siblings",cpuid);
  __stream = fopen(path,"rb");
  if (__stream == (FILE *)0x0) {
    thread_siblings = -1;
  }
  else {
    thread_siblings = -1;
    __isoc99_fscanf(__stream,"%x",&thread_siblings);
    fclose(__stream);
  }
  return thread_siblings;
}

Assistant:

static int get_thread_siblings(int cpuid)
{
    char path[256];
    sprintf(path, "/sys/devices/system/cpu/cpu%d/topology/thread_siblings", cpuid);

    FILE* fp = fopen(path, "rb");
    if (!fp)
        return -1;

    int thread_siblings = -1;
    int nscan = fscanf(fp, "%x", &thread_siblings);
    if (nscan != 1)
    {
        // ignore
    }

    fclose(fp);

    return thread_siblings;
}